

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.h
# Opt level: O2

void __thiscall wasm::TryTable::TryTable(TryTable *this,MixedArena *allocator)

{
  (this->super_SpecificExpression<(wasm::Expression::Id)53>).super_Expression._id = TryTableId;
  (this->super_SpecificExpression<(wasm::Expression::Id)53>).super_Expression.type.id = 0;
  (this->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data = (Name *)0x0;
  (this->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements = 0;
  (this->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.allocatedElements = 0
  ;
  (this->catchTags).allocator = allocator;
  (this->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data = (Name *)0x0;
  (this->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements = 0;
  (this->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.allocatedElements =
       0;
  (this->catchDests).allocator = allocator;
  (this->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>.allocatedElements = 0;
  (this->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>.data = (bool *)0x0;
  (this->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>.usedElements = 0;
  (this->catchRefs).allocator = allocator;
  (this->sentTypes).super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.data = (Type *)0x0;
  (this->sentTypes).super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.usedElements = 0;
  (this->sentTypes).super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.allocatedElements = 0
  ;
  (this->sentTypes).allocator = allocator;
  return;
}

Assistant:

TryTable(MixedArena& allocator)
    : catchTags(allocator), catchDests(allocator), catchRefs(allocator),
      sentTypes(allocator) {}